

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  char cVar4;
  longlong *plVar5;
  longlong *plVar6;
  longlong *plVar7;
  long lVar8;
  undefined1 *puVar9;
  pointer puVar10;
  undefined4 uVar11;
  undefined2 uVar12;
  int iVar13;
  unsigned_short *puVar14;
  longlong **pplVar15;
  uchar *__src;
  ushort *puVar16;
  pointer pPVar17;
  void *pvVar18;
  void *__s;
  long *plVar19;
  longlong *hcode;
  undefined8 uVar20;
  uint uVar21;
  long lVar22;
  pointer pPVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  pointer pPVar28;
  pointer pPVar29;
  ushort *puVar30;
  ushort uVar31;
  float fVar32;
  int iVar33;
  value_type_conflict3 *__val;
  long lVar34;
  byte bVar35;
  value_type_conflict6 *__val_1;
  ulong uVar36;
  ulong uVar37;
  ushort *puVar38;
  longlong **pplVar39;
  ulong uVar40;
  uint uVar41;
  uint uVar42;
  char *pcVar43;
  uint uVar44;
  ushort *puVar45;
  int *piVar46;
  ushort uVar47;
  uint uVar48;
  ushort *puVar49;
  char cVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  int *piVar54;
  short as;
  uint uVar55;
  ulong uVar56;
  ulong uVar57;
  ushort uVar58;
  uint uVar59;
  int iVar60;
  ulong uVar61;
  int i_1;
  long lVar62;
  ulong uVar63;
  bool bVar64;
  undefined4 in_stack_00000014;
  _Iter_comp_iter<tinyexr::FHeapCompare> __cmp;
  undefined4 in_stack_0000001c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  pointer local_170;
  allocator_type local_161;
  ulong local_160;
  ulong local_158;
  int *local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  ulong local_130;
  char *local_128;
  ushort *local_120;
  pointer local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_f8;
  ulong local_e0;
  longlong **local_d8;
  long *local_d0;
  ulong local_c8;
  pointer local_c0;
  int local_b8;
  int local_b4;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  void *local_98;
  uint local_90;
  uint local_8c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  void *local_70;
  ushort *local_68;
  pointer local_60;
  ulong local_58;
  pointer local_50;
  long local_48;
  long local_40;
  pointer local_38;
  
  local_160 = CONCAT44(local_160._4_4_,param_6);
  local_170 = (pointer)CONCAT44(local_170._4_4_,width);
  local_c0 = (pointer)CONCAT44(local_c0._4_4_,compression_type);
  local_158 = (ulong)x_stride;
  pPVar17 = (pointer)CONCAT44(in_stack_0000001c,num_lines);
  lVar62 = (long)param_4;
  local_b0 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_110,local_158 * lVar62 * CONCAT44(in_stack_00000014,line_no),
             (allocator_type *)&local_148);
  uVar11 = local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
  iVar60 = (int)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  puVar14 = pPVar17->start;
  local_150 = (int *)CONCAT44(local_150._4_4_,param_4);
  if (pPVar17->end != puVar14) {
    lVar22 = (long)(int)(uint)local_160;
    lVar27 = (long)width;
    local_170 = (pointer)(local_158 & 0xffffffff);
    uVar61 = (ulong)(uint)param_4;
    local_d8 = (longlong **)(lVar22 * lVar27 * 4);
    local_160 = lVar27 * 4;
    local_128 = (char *)(lVar22 * lVar27 * 2);
    local_120 = (ushort *)(lVar27 * 2);
    uVar56 = 0;
    do {
      iVar13 = *(int *)(puVar14 + uVar56 * 0x1c + 0x10);
      if (iVar13 == 2) {
        if (*(int *)(puVar14 + uVar56 * 0x1c + 0x12) == 1) {
          if (0 < (int)(uint)local_158) {
            lVar22 = 0;
            pPVar17 = (pointer)0x0;
            pplVar15 = local_d8;
            do {
              lVar27 = *(long *)(*(long *)pixel_data_size + uVar56 * 8);
              if ((ulong)(CONCAT44(local_110.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_110.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pPVar17 * CONCAT44(in_stack_00000014,line_no) + lVar27) * lVar62))
              goto LAB_001d6c02;
              if (0 < param_4) {
                lVar27 = CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) +
                         (lVar27 + lVar22) * lVar62;
                uVar37 = 0;
                do {
                  uVar21 = *(uint *)(images[uVar56] + (long)pplVar15 + uVar37 * 4);
                  uVar41 = uVar21 >> 0x17;
                  uVar42 = uVar41 & 0xff;
                  uVar31 = (ushort)uVar42;
                  if ((char)uVar41 != '\0') {
                    if (uVar42 == 0xff) {
                      uVar31 = ((uVar21 & 0x7fffff) != 0 | 0x3e) << 9;
                    }
                    else {
                      uVar31 = 0x7c00;
                      if (uVar42 < 0x8f) {
                        if (uVar42 < 0x71) {
                          uVar31 = 0;
                          if (uVar42 < 0x66) goto LAB_001d55a1;
                          uVar48 = uVar21 & 0x7fffff | 0x800000;
                          uVar31 = (ushort)(uVar48 >> (0x7eU - (char)uVar41 & 0x1f));
                          uVar48 = uVar48 >> (0x7d - uVar42 & 0x1f);
                        }
                        else {
                          uVar31 = ((ushort)(uVar21 >> 0xd) & 0x3ff |
                                   (ushort)((uVar41 & 0x1f) << 10)) ^ 0x4000;
                          uVar48 = uVar21 >> 0xc;
                        }
                        uVar31 = uVar31 + ((uVar48 & 1) != 0);
                      }
LAB_001d55a1:
                      uVar31 = uVar31 & 0x7fff;
                    }
                  }
                  *(char *)(lVar27 + uVar37 * 2) = (char)uVar31;
                  *(byte *)(lVar27 + 1 + uVar37 * 2) =
                       (byte)(uVar21 >> 0x18) & 0x80 | (byte)(uVar31 >> 8);
                  uVar37 = uVar37 + 1;
                } while (uVar61 != uVar37);
              }
              pPVar17 = (pointer)((long)&pPVar17->start + 1);
              lVar22 = lVar22 + CONCAT44(in_stack_00000014,line_no);
              pplVar15 = (longlong **)((long)pplVar15 + local_160);
            } while (pPVar17 != local_170);
          }
        }
        else {
          if (*(int *)(puVar14 + uVar56 * 0x1c + 0x12) != 2) {
LAB_001d5a37:
            if (channels !=
                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
              std::__cxx11::string::append((char *)channels);
            }
            goto LAB_001d5c12;
          }
          if (0 < (int)(uint)local_158) {
            lVar22 = 0;
            pPVar17 = (pointer)0x0;
            pplVar15 = local_d8;
            do {
              lVar27 = *(long *)(*(long *)pixel_data_size + uVar56 * 8);
              if ((ulong)(CONCAT44(local_110.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_110.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pPVar17 * CONCAT44(in_stack_00000014,line_no) + lVar27) * lVar62))
              goto LAB_001d6bf4;
              if (0 < param_4) {
                uVar37 = 0;
                do {
                  *(undefined4 *)
                   (CONCAT44(local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                    (lVar27 + lVar22) * lVar62 + uVar37 * 4) =
                       *(undefined4 *)(images[uVar56] + (long)pplVar15 + uVar37 * 4);
                  uVar37 = uVar37 + 1;
                } while (uVar61 != uVar37);
              }
              pPVar17 = (pointer)((long)&pPVar17->start + 1);
              lVar22 = lVar22 + CONCAT44(in_stack_00000014,line_no);
              pplVar15 = (longlong **)((long)pplVar15 + local_160);
            } while (pPVar17 != local_170);
          }
        }
      }
      else if (iVar13 == 1) {
        if (*(int *)(puVar14 + uVar56 * 0x1c + 0x12) == 2) {
          if (0 < (int)(uint)local_158) {
            lVar22 = 0;
            pPVar17 = (pointer)0x0;
            pcVar43 = local_128;
            do {
              lVar27 = *(long *)(*(long *)pixel_data_size + uVar56 * 8);
              if ((ulong)(CONCAT44(local_110.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_110.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pPVar17 * CONCAT44(in_stack_00000014,line_no) + lVar27) * lVar62))
              goto LAB_001d6c10;
              if (0 < param_4) {
                lVar27 = CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) +
                         (lVar27 + lVar22) * lVar62;
                uVar37 = 0;
                do {
                  uVar31 = *(ushort *)(images[uVar56] + (long)pcVar43 + uVar37 * 2);
                  uVar21 = (uint)uVar31 << 0xd;
                  if ((uVar21 & 0xf800000) == 0xf800000) {
                    fVar32 = (float)(uVar21 | 0x70000000);
                  }
                  else if ((uVar21 & 0xf800000) == 0) {
                    fVar32 = (float)(uVar21 | 0x38800000) + -6.1035156e-05;
                  }
                  else {
                    fVar32 = (float)((uVar21 & 0xfffe000) + 0x38000000);
                  }
                  *(char *)(lVar27 + uVar37 * 4) = SUB41(fVar32,0);
                  *(char *)(lVar27 + 1 + uVar37 * 4) = (char)((uint)fVar32 >> 8);
                  *(char *)(lVar27 + 2 + uVar37 * 4) = (char)((uint)fVar32 >> 0x10);
                  *(byte *)(lVar27 + 3 + uVar37 * 4) =
                       (byte)((short)uVar31 >> 0xf) & 0x80 | (byte)((uint)fVar32 >> 0x18);
                  uVar37 = uVar37 + 1;
                } while (uVar61 != uVar37);
              }
              pPVar17 = (pointer)((long)&pPVar17->start + 1);
              lVar22 = lVar22 + CONCAT44(in_stack_00000014,line_no);
              pcVar43 = pcVar43 + (long)local_120;
            } while (pPVar17 != local_170);
          }
        }
        else {
          if (*(int *)(puVar14 + uVar56 * 0x1c + 0x12) != 1) goto LAB_001d5a37;
          if (0 < (int)(uint)local_158) {
            lVar22 = 0;
            pPVar17 = (pointer)0x0;
            pcVar43 = local_128;
            do {
              lVar27 = *(long *)(*(long *)pixel_data_size + uVar56 * 8);
              if ((ulong)(CONCAT44(local_110.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_110.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) <=
                  (ulong)(((long)pPVar17 * CONCAT44(in_stack_00000014,line_no) + lVar27) * lVar62))
              goto LAB_001d6c1e;
              if (0 < param_4) {
                uVar37 = 0;
                do {
                  *(undefined2 *)
                   (CONCAT44(local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) +
                    (lVar27 + lVar22) * lVar62 + uVar37 * 2) =
                       *(undefined2 *)(images[uVar56] + (long)pcVar43 + uVar37 * 2);
                  uVar37 = uVar37 + 1;
                } while (uVar61 != uVar37);
              }
              pPVar17 = (pointer)((long)&pPVar17->start + 1);
              lVar22 = lVar22 + CONCAT44(in_stack_00000014,line_no);
              pcVar43 = pcVar43 + (long)local_120;
            } while (pPVar17 != local_170);
          }
        }
      }
      else if ((iVar13 == 0) && (0 < (int)(uint)local_158)) {
        lVar22 = 0;
        pPVar17 = (pointer)0x0;
        pplVar15 = local_d8;
        do {
          lVar27 = *(long *)(*(long *)pixel_data_size + uVar56 * 8);
          if ((ulong)(CONCAT44(local_110.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int)local_110.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) -
                     CONCAT44(local_110.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_110.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) <=
              (ulong)(((long)pPVar17 * CONCAT44(in_stack_00000014,line_no) + lVar27) * lVar62)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_001d6bf4;
          }
          if (0 < param_4) {
            uVar37 = 0;
            do {
              *(undefined4 *)
               (CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)local_110.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) + (lVar27 + lVar22) * lVar62
               + uVar37 * 4) = *(undefined4 *)(images[uVar56] + (long)pplVar15 + uVar37 * 4);
              uVar37 = uVar37 + 1;
            } while (uVar61 != uVar37);
          }
          pPVar17 = (pointer)((long)&pPVar17->start + 1);
          lVar22 = lVar22 + CONCAT44(in_stack_00000014,line_no);
          pplVar15 = (longlong **)((long)pplVar15 + local_160);
        } while (pPVar17 != local_170);
      }
      pPVar17 = (pointer)CONCAT44(in_stack_00000014,line_no);
      uVar56 = uVar56 + 1;
      puVar14 = *(unsigned_short **)CONCAT44(in_stack_0000001c,num_lines);
    } while (uVar56 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - (long)puVar14 >>
                              3) * 0x6db6db6db6db6db7));
  }
  if ((uint)local_c0 == 0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_b0,*(undefined8 *)(local_b0 + 8),
               CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start),
               CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish));
LAB_001d6bc1:
    bVar64 = true;
    goto LAB_001d6bc3;
  }
  if (((uint)local_c0 & 0xfffffffe) == 2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
               (CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (int)local_110.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish) -
               CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) * 2 + 0x100,
               (allocator_type *)&local_148);
    pPVar17 = local_f8.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar61 = (long)local_f8.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_f8.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar61 == 0) {
LAB_001d6c2c:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6c3e:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6c50:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    else {
      images = (uchar **)
               CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      puVar9 = (undefined1 *)
               CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
      uVar56 = (long)puVar9 - (long)images;
      if (uVar56 == 0) goto LAB_001d6c2c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_148,uVar56,(allocator_type *)&local_88);
      if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001d6c3e;
      if (0 < (long)uVar56) {
        lVar62 = 0;
        do {
          puVar2 = (undefined1 *)((long)&((pointer)images)->start + lVar62 * 2);
          *(undefined1 *)
           ((long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar62) = *puVar2;
          if (puVar9 <= puVar2 + 1) break;
          *(undefined1 *)
           ((long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar62 + (uVar56 + 1 >> 1)) = puVar2[1]
          ;
          lVar62 = lVar62 + 1;
        } while (puVar2 + 2 < puVar9);
      }
      if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001d6c50;
      if (1 < (long)uVar56) {
        pcVar43 = (char *)((long)local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        cVar50 = *local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          cVar4 = *pcVar43;
          *pcVar43 = (cVar4 - cVar50) + -0x80;
          pcVar43 = pcVar43 + 1;
          cVar50 = cVar4;
        } while (pcVar43 < (char *)((long)local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar56));
      }
      if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __src = stbi_zlib_compress(local_148.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(int)uVar56,
                                   (int *)&local_88,8);
        if (__src != (uchar *)0x0) {
          memcpy(pPVar17,__src,
                 (long)(int)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          free(__src);
          uVar61 = (long)(int)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          if (uVar56 <= (ulong)(long)(int)local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start) {
            memcpy(pPVar17,images,uVar56);
            uVar61 = uVar56;
          }
        }
        if ((ushort *)
            local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (__src == (uchar *)0x0) {
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
        }
        else {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_b0,*(undefined8 *)(local_b0 + 8),
                     local_f8.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (long)&(local_f8.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start)->start +
                     (uVar61 & 0xffffffff));
        }
        if (local_f8.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (__src != (uchar *)0x0) goto LAB_001d6bc1;
        goto LAB_001d5c12;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6c74:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6c86:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6c98:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6caa:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6cbc:
    local_130 = 0;
LAB_001d6cc5:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               local_130);
LAB_001d6cda:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001d6cec:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,pPVar17
              );
  }
  else {
    if ((uint)local_c0 == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
LAB_001d5c12:
      bVar64 = false;
LAB_001d6bc3:
      if ((void *)CONCAT44(local_110.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)local_110.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_110.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (int)local_110.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
      }
      return bVar64;
    }
    if ((uint)local_c0 != 4) {
      if ((uint)local_c0 != 1) goto LAB_001d5c12;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                 (ulong)((CONCAT44(local_110.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_110.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) * 3) >> 1,
                 (allocator_type *)&local_148);
      pPVar23 = local_f8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_f8.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_f8.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start) goto LAB_001d6c74;
      images = (uchar **)
               CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      pPVar17 = (pointer)CONCAT44(local_110.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (int)local_110.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
      uVar61 = (long)pPVar17 - (long)images;
      if (uVar61 == 0) goto LAB_001d6c74;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_148,uVar61,(allocator_type *)&local_88);
      if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001d6c86;
      if (0 < (long)uVar61) {
        puVar16 = (ushort *)
                  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar28 = (pointer)images;
        do {
          pPVar29 = (pointer)((long)&pPVar28->start + 1);
          *(char *)puVar16 = *(char *)&pPVar28->start;
          if (pPVar17 <= pPVar29) break;
          *(char *)((long)puVar16 + (uVar61 + 1 >> 1)) = *(char *)&pPVar29->start;
          puVar16 = (ushort *)((long)puVar16 + 1);
          pPVar28 = (pointer)((long)&pPVar28->start + 2);
        } while (pPVar28 < pPVar17);
      }
      if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001d6c98;
      if (1 < (long)uVar61) {
        pcVar43 = (char *)((long)local_148.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
        cVar50 = *local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          cVar4 = *pcVar43;
          *pcVar43 = (cVar4 - cVar50) + -0x80;
          pcVar43 = pcVar43 + 1;
          cVar50 = cVar4;
        } while (pcVar43 < (char *)((long)local_148.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar61));
      }
      if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pPVar17 = pPVar23;
        if (0 < (int)uVar61) {
          puVar30 = (ushort *)
                    ((long)(int)uVar61 +
                    (long)local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
          puVar16 = (ushort *)
                    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar38 = (ushort *)
                    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar43 = (char *)(~(ulong)puVar16 + (long)puVar38);
            lVar62 = 0;
            lVar22 = 1;
            do {
              lVar27 = lVar22;
              lVar34 = lVar62;
              puVar45 = (ushort *)((long)puVar16 + lVar34 + 1);
              if (puVar30 <= puVar45) {
                pcVar43 = (char *)((long)puVar16 + (lVar34 - (long)puVar38) + 1);
                puVar49 = puVar45;
                if ((long)pcVar43 < 3) goto LAB_001d5a05;
                goto LAB_001d59de;
              }
              if ((long)pcVar43 < -0x7f) break;
              pcVar43 = pcVar43 + -1;
              lVar62 = lVar34 + 1;
              lVar22 = lVar27 + 1;
            } while ((char)*puVar38 == (char)*puVar45);
            pcVar43 = (char *)((long)puVar16 + ((lVar34 + 1) - (long)puVar38));
            if ((long)pcVar43 < 3) {
              puVar49 = (ushort *)((long)puVar16 + lVar34 + 2);
              cVar50 = (char)*puVar45;
              if (puVar49 < puVar30) {
                do {
                  lVar62 = lVar27;
                  puVar45 = (ushort *)((long)puVar16 + lVar62 + 2);
                  cVar4 = *(char *)((long)puVar16 + lVar62 + 1);
                  if ((cVar50 == cVar4) && (puVar45 < puVar30)) {
                    if ((0x7e < (long)((long)puVar16 + (lVar62 - (long)puVar38))) ||
                       (cVar50 == *(char *)((long)puVar16 + lVar62 + 2))) goto LAB_001d59fb;
                  }
                  else if (0x7e < (long)((long)puVar16 + (lVar62 - (long)puVar38))) {
LAB_001d59fb:
                    puVar49 = (ushort *)((long)puVar16 + lVar62);
                    goto LAB_001d5a05;
                  }
                  lVar27 = lVar62 + 1;
                  cVar50 = cVar4;
                } while (puVar45 < puVar30);
                puVar49 = (ushort *)((long)puVar16 + lVar62 + 2);
                if (0x7e < (long)((long)puVar16 + (lVar27 - (long)puVar38))) {
                  puVar49 = (ushort *)((long)puVar16 + lVar27);
                }
              }
LAB_001d5a05:
              *(char *)&pPVar17->start = (char)puVar38 - (char)puVar49;
              pPVar17 = (pointer)((long)&pPVar17->start + 1);
              puVar16 = puVar49;
              if (puVar38 < puVar49) {
                lVar62 = (long)puVar49 - (long)puVar38;
                do {
                  uVar31 = *puVar38;
                  puVar38 = (ushort *)((long)puVar38 + 1);
                  *(char *)&pPVar17->start = (char)uVar31;
                  pPVar17 = (pointer)((long)&pPVar17->start + 1);
                  lVar62 = lVar62 + -1;
                } while (lVar62 != 0);
              }
            }
            else {
LAB_001d59de:
              *(char *)&pPVar17->start = (char)pcVar43 + -1;
              *(char *)((long)&pPVar17->start + 1) = (char)*puVar38;
              pPVar17 = (pointer)((long)&pPVar17->start + 2);
              puVar38 = (ushort *)((long)puVar16 + lVar34 + 1);
              puVar16 = puVar38;
            }
          } while (puVar38 < puVar30);
        }
        uVar56 = (ulong)((int)pPVar17 - (int)pPVar23);
        if (uVar61 <= uVar56) {
          memcpy(pPVar23,images,uVar61);
          uVar56 = uVar61;
        }
        if ((ushort *)
            local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ushort *)0x0) {
          operator_delete(local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (local_b0,*(undefined8 *)(local_b0 + 8),
                   local_f8.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (long)&(local_f8.
                           super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->start + (uVar56 & 0xffffffff)
                  );
        goto LAB_001d6bb7;
      }
      goto LAB_001d6caa;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_88,
               (ulong)(((int)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_110.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
               (allocator_type *)&local_148);
    local_68 = (ushort *)
               CONCAT44(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    images = (uchar **)CONCAT44(in_stack_0000001c,num_lines);
    if ((ushort *)
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == local_68) goto LAB_001d6cbc;
    local_70 = (void *)CONCAT44(local_110.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_110.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    uVar61 = CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)local_110.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) - (long)local_70;
    local_130 = uVar61;
    if (uVar61 == 0) goto LAB_001d6cc5;
    pPVar17 = (pointer)operator_new(0x2000);
    memset(pPVar17,0,0x2000);
    local_118 = pPVar17;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_148,uVar61 >> 1,
               (allocator_type *)&local_f8);
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&local_f8,
               ((long)((pointer)images)->end - (long)((pointer)images)->start >> 3) *
               0x6db6db6db6db6db7,&local_161);
    if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001d6cda;
    iVar60 = (int)local_158;
    if (local_f8.
        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_f8.
        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      lVar62 = 0x24;
      lVar22 = 0x1c;
      uVar61 = 0;
      puVar16 = (ushort *)
                local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        *(ushort **)
         ((long)local_f8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar22 + -0x1c) = puVar16;
        *(ushort **)
         ((long)local_f8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar22 + -0x14) = puVar16;
        *(int *)((long)local_f8.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar22 + -0xc) = (int)local_150;
        *(int *)((long)local_f8.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8) = iVar60;
        bVar64 = *(int *)((long)((pointer)images)->start + lVar62) != 1;
        *(uint *)((long)&(local_f8.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->start + lVar22) = bVar64 + 1;
        puVar16 = puVar16 + (iVar60 * (int)local_150 << bVar64);
        uVar61 = uVar61 + 1;
        lVar62 = lVar62 + 0x38;
        lVar22 = lVar22 + 0x20;
      } while (uVar61 < (ulong)((long)local_f8.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_f8.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (0 < iVar60) {
      pPVar17 = local_f8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pPVar23 = (pointer)0x0;
      pvVar18 = local_70;
      pPVar28 = local_f8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_170 = pPVar23;
        bVar64 = pPVar17 != pPVar28;
        pPVar17 = pPVar28;
        if (bVar64) {
          lVar62 = 8;
          uVar61 = 0;
          do {
            images = (uchar **)
                     ((long)*(int *)((long)&pPVar28->ny + lVar62) *
                     (long)*(int *)((long)&pPVar28->end + lVar62));
            memcpy(*(void **)((long)&pPVar28->start + lVar62),pvVar18,(long)images * 2);
            pvVar18 = (void *)((long)pvVar18 + (long)images * 2);
            plVar19 = (long *)((long)&pPVar28->start + lVar62);
            *plVar19 = *plVar19 + (long)images * 2;
            uVar61 = uVar61 + 1;
            lVar62 = lVar62 + 0x20;
            pPVar17 = local_f8.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pPVar28 = local_f8.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar61 < (ulong)((long)local_f8.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_f8.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        uVar21 = (int)local_170 + 1;
        pPVar23 = (pointer)(ulong)uVar21;
      } while (uVar21 != (uint)local_158);
    }
    puVar10 = local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar17 = (pointer)((long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_148.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 1);
    if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001d6cec;
    bVar35 = 0;
    memset(local_118,0,0x2000);
    uVar61 = local_130;
    if (0 < (int)(uint)pPVar17) {
      uVar56 = 0;
      do {
        pbVar3 = (byte *)((long)&local_118->start +
                         (ulong)(*(ushort *)((long)puVar10 + uVar56 * 2) >> 3));
        *pbVar3 = *pbVar3 | (byte)(1 << ((byte)*(ushort *)((long)puVar10 + uVar56 * 2) & 7));
        uVar56 = uVar56 + 1;
      } while (((uint)pPVar17 & 0x7fffffff) != uVar56);
      bVar35 = *(byte *)&local_118->start & 0xfe;
    }
    *(byte *)&local_118->start = bVar35;
    uVar36 = 0x1fff;
    pPVar23 = (pointer)0x0;
    uVar56 = 0;
    uVar37 = 0;
    do {
      if (*(char *)((long)&local_118->start + uVar37) != '\0') {
        uVar36 = uVar36 & 0xffff;
        bVar64 = uVar37 < uVar36;
        if (bVar64) {
          uVar36 = uVar37 & 0xffffffff;
        }
        uVar21 = (uint)uVar56;
        if (bVar64) {
          uVar21 = (uint)pPVar23;
        }
        if ((ushort)uVar21 < uVar37) {
          pPVar23 = (pointer)(uVar37 & 0xffffffff);
        }
        uVar56 = (ulong)uVar21;
        if ((ushort)uVar21 < uVar37) {
          uVar56 = uVar37 & 0xffffffff;
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != 0x2000);
    pvVar18 = operator_new(0x20000);
    uVar56 = 0;
    memset(pvVar18,0,0x20000);
    local_c8 = 0;
    do {
      if ((uVar56 == 0) ||
         ((*(byte *)((long)&local_118->start + (uVar56 >> 3 & 0x1fffffff)) >> ((uint)uVar56 & 7) & 1
          ) != 0)) {
        uVar12 = (undefined2)local_c8;
        local_c8 = (ulong)((int)local_c8 + 1);
      }
      else {
        uVar12 = 0;
      }
      *(undefined2 *)((long)pvVar18 + uVar56 * 2) = uVar12;
      uVar56 = uVar56 + 1;
    } while (uVar56 != 0x10000);
    pPVar17 = pPVar23;
    local_98 = pvVar18;
    if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar21 = (uint)((long)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_148.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 1);
      if (0 < (int)uVar21) {
        uVar56 = 0;
        do {
          *(ushort *)
           ((long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar56 * 2) =
               *(ushort *)
                ((long)pvVar18 +
                (ulong)*(ushort *)
                        ((long)local_148.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar56 * 2) * 2);
          uVar56 = uVar56 + 1;
        } while ((uVar21 & 0x7fffffff) != uVar56);
      }
      *local_68 = (ushort)uVar36;
      local_68[1] = (ushort)pPVar23;
      pPVar17 = (pointer)(local_68 + 2);
      if ((ushort)uVar36 <= (ushort)pPVar23) {
        lVar62 = ((ulong)pPVar23 & 0xffff) - (uVar36 & 0xffff);
        memcpy(pPVar17,(void *)((long)&local_118->start + (uVar36 & 0xffff)),lVar62 + 1);
        pPVar17 = (pointer)((long)pPVar17 + lVar62 + 1);
      }
      if (local_f8.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_f8.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar21 = (int)local_c8 - 1;
        local_c8 = (ulong)uVar21;
        uVar56 = 0;
        do {
          iVar60 = local_f8.
                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar56].size;
          if (0 < iVar60) {
            local_50 = local_f8.
                       super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar56;
            lVar62 = 0;
            lVar22 = 0;
            do {
              uVar41 = local_50->nx;
              uVar42 = local_50->ny;
              local_8c = uVar42;
              if ((int)uVar41 < (int)uVar42) {
                local_8c = uVar41;
              }
              iVar13 = iVar60;
              if (1 < (int)local_8c) {
                local_60 = (pointer)(local_50->start + lVar22);
                local_b8 = uVar41 * iVar60;
                local_38 = (pointer)((long)local_50->start + lVar62);
                local_128 = (char *)CONCAT44(local_128._4_4_,uVar41);
                uVar61 = 2;
                uVar48 = 1;
                do {
                  local_a8 = uVar61;
                  uVar24 = (uint)local_a8;
                  iVar13 = (uVar42 - uVar24) * local_b8;
                  local_150 = (int *)CONCAT44(local_150._4_4_,uVar48);
                  local_d0 = (long *)(long)(int)(uVar48 * iVar60);
                  local_e0 = (ulong)(int)(uVar24 * iVar60);
                  uVar44 = uVar21 & 0xffff;
                  pPVar23 = local_60;
                  if (-1 < iVar13) {
                    iVar25 = (uVar41 - uVar24) * iVar60;
                    local_158 = CONCAT44(local_158._4_4_,iVar25);
                    local_a0 = (undefined1 *)(long)iVar25;
                    local_160 = (ulong)(int)(uVar48 * local_b8);
                    local_d8 = (longlong **)((long)(int)(uVar24 * local_b8) * 2);
                    lVar8 = local_160 * 2;
                    lVar34 = (long)local_d0 * 2;
                    lVar27 = lVar34 + local_160 * 2;
                    pPVar23 = local_38;
                    do {
                      local_170 = pPVar23;
                      pPVar23 = local_170;
                      if (-1 < iVar25) {
                        do {
                          uVar31 = *(ushort *)&pPVar23->start;
                          uVar58 = *(ushort *)((long)&pPVar23->start + lVar34);
                          if (uVar44 < 0x4000) {
                            iVar51 = (int)(short)uVar31 - (int)(short)uVar58;
                            uVar55 = (uint)*(short *)((long)&pPVar23->start + lVar8);
                            images = (uchar **)(ulong)uVar55;
                            iVar33 = (int)*(short *)((long)&pPVar23->start + lVar27);
                            iVar26 = uVar55 - iVar33;
                            uVar59 = (int)(short)uVar58 + (int)(short)uVar31;
                            uVar55 = iVar33 + uVar55;
                            iVar33 = (uVar59 >> 1) - (uVar55 >> 1);
                            uVar31 = (ushort)((uint)(((int)uVar55 >> 1) + ((int)uVar59 >> 1)) >> 1);
                            uVar58 = (ushort)((uint)((int)(short)iVar26 + (int)(short)iVar51) >> 1);
                            iVar51 = iVar51 - iVar26;
                          }
                          else {
                            images = (uchar **)0xffff;
                            uVar59 = (uVar31 ^ 0x8000) - (uint)uVar58;
                            uVar55 = (uint)*(ushort *)((long)&pPVar23->start + lVar27);
                            uVar52 = *(ushort *)((long)&pPVar23->start + lVar8) ^ 0x8000;
                            uVar53 = uVar52 - uVar55;
                            uVar55 = uVar53 >> 0x10 & 0x8000 ^ uVar52 + uVar55 >> 1;
                            uVar52 = (uint)uVar58 + (uVar31 ^ 0x8000) >> 1 ^ 0x8000 ^
                                     uVar59 >> 0x10 & 0x8000;
                            iVar33 = uVar52 - uVar55;
                            uVar31 = (ushort)((uint)iVar33 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar55 + uVar52 >> 1);
                            uVar55 = uVar59 & 0xffff ^ 0x8000;
                            uVar53 = uVar53 & 0xffff;
                            iVar51 = uVar55 - uVar53;
                            uVar58 = (ushort)((uint)iVar51 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar53 + uVar55 >> 1);
                          }
                          *(ushort *)&pPVar23->start = uVar31;
                          *(short *)((long)&pPVar23->start + lVar8) = (short)iVar33;
                          *(ushort *)((long)&pPVar23->start + lVar34) = uVar58;
                          *(short *)((long)&pPVar23->start + lVar27) = (short)iVar51;
                          pPVar23 = (pointer)((long)&pPVar23->start + local_e0 * 2);
                        } while (pPVar23 <= (pointer)((long)&local_170->start + (long)local_a0 * 2))
                        ;
                      }
                      if ((uVar48 & uVar41) != 0) {
                        uVar31 = *(ushort *)&pPVar23->start;
                        uVar58 = *(ushort *)((long)&pPVar23->start + local_160 * 2);
                        if (uVar44 < 0x4000) {
                          uVar47 = (ushort)((uint)((int)(short)uVar58 + (int)(short)uVar31) >> 1);
                          iVar51 = (int)(short)uVar31 - (int)(short)uVar58;
                        }
                        else {
                          iVar51 = (uVar31 ^ 0x8000) - (uint)uVar58;
                          uVar47 = (ushort)((uint)iVar51 >> 0x10) & 0x8000 ^
                                   (ushort)((uVar31 ^ 0x8000) + (uint)uVar58 >> 1);
                        }
                        *(short *)((long)&pPVar23->start + local_160 * 2) = (short)iVar51;
                        *(ushort *)&pPVar23->start = uVar47;
                      }
                      pPVar23 = (pointer)((long)&local_170->start + (long)local_d8);
                      pvVar18 = local_98;
                    } while (pPVar23 <= (pointer)((long)&local_60->start + (long)iVar13 * 2));
                  }
                  if (((uVar48 & uVar42) != 0) && (iVar13 = (uVar41 - uVar24) * iVar60, -1 < iVar13)
                     ) {
                    local_e0 = local_e0 * 2;
                    pPVar28 = pPVar23;
                    do {
                      images = (uchar **)pPVar28;
                      uVar31 = *(ushort *)&((pointer)images)->start;
                      uVar58 = *(ushort *)((long)&((pointer)images)->start + (long)local_d0 * 2);
                      if (uVar44 < 0x4000) {
                        uVar47 = (ushort)((uint)((int)(short)uVar58 + (int)(short)uVar31) >> 1);
                        iVar25 = (int)(short)uVar31 - (int)(short)uVar58;
                      }
                      else {
                        iVar25 = (uVar31 ^ 0x8000) - (uint)uVar58;
                        uVar47 = (ushort)((uint)iVar25 >> 0x10) & 0x8000 ^
                                 (ushort)((uVar31 ^ 0x8000) + (uint)uVar58 >> 1);
                      }
                      *(short *)((long)&((pointer)images)->start + (long)local_d0 * 2) =
                           (short)iVar25;
                      *(ushort *)&((pointer)images)->start = uVar47;
                      pPVar28 = (pointer)((long)&((pointer)images)->start + local_e0);
                    } while (pPVar28 <= (pointer)((long)&pPVar23->start + (long)iVar13 * 2));
                  }
                  uVar61 = (ulong)(uVar24 * 2);
                  uVar48 = uVar24;
                } while ((int)(uVar24 * 2) <= (int)local_8c);
                uVar61 = local_130;
                iVar13 = local_50->size;
                local_b4 = iVar60;
                local_90 = uVar42;
                local_48 = lVar22;
                local_40 = lVar62;
              }
              iVar60 = iVar13;
              lVar22 = lVar22 + 1;
              lVar62 = lVar62 + 2;
              local_58 = uVar56;
            } while (lVar22 < iVar60);
          }
          uVar56 = uVar56 + 1;
        } while (uVar56 < (ulong)((long)local_f8.
                                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_f8.
                                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      *(undefined4 *)&pPVar17->start = 0;
      uVar56 = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1;
      local_120 = (ushort *)
                  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_c0 = pPVar17;
      if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_001d6d0f;
      puVar9 = (undefined1 *)((long)&pPVar17->start + 4);
      local_160 = uVar56;
      if ((int)uVar56 == 0) {
        iVar13 = (int)puVar9;
        iVar60 = 0;
      }
      else {
        __s = operator_new(0x80008);
        memset(__s,0,0x80008);
        if (0 < (int)(uint)local_160) {
          uVar56 = 0;
          do {
            plVar19 = (long *)((long)__s + (ulong)local_120[uVar56] * 8);
            *plVar19 = *plVar19 + 1;
            uVar56 = uVar56 + 1;
          } while (((uint)local_160 & 0x7fffffff) != uVar56);
        }
        pvVar18 = operator_new(0x40004);
        memset(pvVar18,0,0x40004);
        pplVar15 = (longlong **)operator_new(0x80008);
        local_a0 = puVar9;
        memset(pplVar15,0,0x80008);
        plVar19 = (long *)((long)__s + -8);
        local_e0 = 0xffffffffffffffff;
        do {
          local_e0 = local_e0 + 1;
          plVar1 = plVar19 + 1;
          plVar19 = plVar19 + 1;
        } while (*plVar1 == 0);
        uVar56 = (ulong)local_128 >> 0x20;
        local_128 = (char *)(uVar56 << 0x20);
        iVar60 = 0;
        if (local_e0 < 0x10001) {
          local_128 = (char *)(uVar56 << 0x20);
          iVar60 = 0;
          uVar56 = local_e0;
          do {
            *(int *)((long)pvVar18 + uVar56 * 4) = (int)uVar56;
            if (*plVar19 != 0) {
              pplVar15[iVar60] = plVar19;
              iVar60 = iVar60 + 1;
              local_128 = (char *)CONCAT44(local_128._4_4_,(int)uVar56);
            }
            uVar56 = uVar56 + 1;
            plVar19 = plVar19 + 1;
          } while (uVar56 != 0x10001);
        }
        local_a8 = (ulong)(int)local_128;
        local_d0 = (long *)((long)__s + local_a8 * 8 + 8);
        *(undefined8 *)((long)__s + local_a8 * 8 + 8) = 1;
        pplVar15[iVar60] = local_d0;
        std::__make_heap<long_long**,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                  (pplVar15,pplVar15 + (long)iVar60 + 1,
                   (_Iter_comp_iter<tinyexr::FHeapCompare> *)&local_161);
        hcode = (longlong *)operator_new(0x80008);
        memset(hcode,0,0x80008);
        if (0 < iVar60) {
          local_150 = (int *)(pplVar15 + -1);
          uVar56 = (ulong)(iVar60 + 1);
          do {
            plVar5 = *pplVar15;
            plVar6 = pplVar15[uVar56 - 1];
            pplVar15[uVar56 - 1] = plVar5;
            std::
            __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                      (pplVar15,0,(long)((long)local_150 + (uVar56 * 8 - (long)pplVar15)) >> 3,
                       plVar6);
            uVar37 = uVar56 - 1;
            plVar6 = *pplVar15;
            pplVar39 = pplVar15 + (uVar56 - 1);
            if (1 < uVar37) {
              plVar7 = pplVar15[uVar56 - 2];
              pplVar15[uVar56 - 2] = plVar6;
              local_158 = uVar37;
              local_d8 = pplVar15 + (uVar56 - 1);
              std::
              __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                        (pplVar15,0,(long)(uVar56 * 8 + -0x10) >> 3,plVar7);
              pplVar39 = local_d8;
              uVar37 = local_158;
            }
            uVar36 = (ulong)((long)plVar5 - (long)__s) >> 3;
            uVar57 = (ulong)((long)plVar6 - (long)__s) >> 3;
            plVar19 = (long *)((long)__s + (long)(int)uVar57 * 8);
            *plVar19 = *plVar19 + *(long *)((long)__s + (long)(int)uVar36 * 8);
            uVar61 = uVar56 - 2;
            plVar19 = pplVar39[-1];
            if (1 < uVar37) {
              do {
                uVar63 = uVar61 - 1;
                uVar40 = uVar63 >> 1;
                if (*pplVar15[uVar40] <= *plVar19) goto LAB_001d65a8;
                pplVar15[uVar61] = pplVar15[uVar40];
                uVar61 = uVar40;
              } while (1 < uVar63);
              uVar61 = 0;
            }
LAB_001d65a8:
            pplVar15[uVar61] = plVar19;
            do {
              uVar41 = (uint)uVar57;
              lVar62 = (long)(int)uVar41;
              hcode[lVar62] = hcode[lVar62] + 1;
              uVar21 = *(uint *)((long)pvVar18 + lVar62 * 4);
              uVar57 = (ulong)uVar21;
            } while (uVar21 != uVar41);
            *(int *)((long)pvVar18 + lVar62 * 4) = (int)uVar36;
            do {
              uVar41 = (uint)uVar36;
              hcode[(int)uVar41] = hcode[(int)uVar41] + 1;
              uVar21 = *(uint *)((long)pvVar18 + (long)(int)uVar41 * 4);
              uVar36 = (ulong)uVar21;
            } while (uVar21 != uVar41);
            bVar64 = 2 < (long)uVar56;
            uVar61 = local_130;
            uVar56 = uVar37;
          } while (bVar64);
        }
        lVar62 = local_a8 + 1;
        hufCanonicalCodeTable(hcode);
        memcpy(__s,hcode,0x80008);
        operator_delete(hcode);
        operator_delete(pplVar15);
        operator_delete(pvVar18);
        pvVar18 = local_98;
        pPVar17 = local_c0;
        local_150 = &local_c0->ys;
        piVar46 = local_150;
        if ((int)local_e0 <= (int)lVar62) {
          uVar56 = 0;
          uVar36 = local_e0 & 0xffffffff;
          uVar37 = 0;
          do {
            iVar13 = (int)uVar36;
            lVar22 = (long)iVar13;
            uVar36 = *(ulong *)((long)__s + lVar22 * 8) & 0x3f;
            iVar60 = (int)uVar56;
            if ((int)local_128 < iVar13 || uVar36 != 0) {
LAB_001d66ab:
              uVar37 = uVar37 << 6 | uVar36;
              if (iVar60 < 2) {
LAB_001d6747:
                uVar56 = (ulong)(iVar60 + 6);
              }
              else {
                uVar56 = (ulong)(iVar60 + 6);
                do {
                  uVar56 = uVar56 - 8;
                  *(char *)piVar46 = (char)((long)uVar37 >> ((byte)uVar56 & 0x3f));
                  piVar46 = (int *)((long)piVar46 + 1);
                } while (7 < uVar56);
              }
            }
            else {
              uVar21 = 1;
              while (uVar41 = uVar21, (*(byte *)((long)__s + lVar22 * 8 + 8) & 0x3f) == 0) {
                lVar22 = lVar22 + 1;
                uVar41 = uVar21 + 1;
                if ((lVar62 <= lVar22) || (bVar64 = 0x103 < uVar21, uVar21 = uVar41, bVar64)) break;
              }
              iVar13 = (int)lVar22;
              if (uVar41 < 2) goto LAB_001d66ab;
              if (uVar41 < 6) {
                uVar37 = uVar37 << 6 | (ulong)(uVar41 + 0x39);
                if (1 < iVar60) {
                  uVar56 = (ulong)(iVar60 + 6);
                  do {
                    uVar56 = uVar56 - 8;
                    *(char *)piVar46 = (char)((long)uVar37 >> ((byte)uVar56 & 0x3f));
                    piVar46 = (int *)((long)piVar46 + 1);
                  } while (7 < uVar56);
                  goto LAB_001d6749;
                }
                goto LAB_001d6747;
              }
              uVar56 = uVar37 << 6 | 0x3f;
              if (iVar60 < 2) {
                uVar37 = uVar56 << 8 | (ulong)(uVar41 - 6);
                uVar21 = iVar60 + 0xe;
                uVar56 = (ulong)uVar21;
                if ((int)(iVar60 + 6U) < 0) goto LAB_001d6749;
              }
              else {
                uVar37 = (ulong)(iVar60 + 6U);
                uVar21 = iVar60 + 0xe;
                do {
                  uVar37 = uVar37 - 8;
                  *(char *)piVar46 = (char)((long)uVar56 >> ((byte)uVar37 & 0x3f));
                  piVar46 = (int *)((long)piVar46 + 1);
                  uVar21 = uVar21 - 8;
                } while (7 < uVar37);
                uVar37 = uVar56 << 8 | (ulong)(uVar41 - 6);
              }
              uVar56 = (ulong)uVar21;
              do {
                uVar56 = uVar56 - 8;
                *(char *)piVar46 = (char)((long)uVar37 >> ((byte)uVar56 & 0x3f));
                piVar46 = (int *)((long)piVar46 + 1);
              } while (7 < uVar56);
            }
LAB_001d6749:
            uVar36 = (ulong)(iVar13 + 1);
          } while (iVar13 <= (int)local_128);
          if (0 < (int)uVar56) {
            *(char *)piVar46 = (char)(uVar37 << (8U - (char)uVar56 & 0x3f));
            piVar46 = (int *)((long)piVar46 + 1);
          }
        }
        uVar31 = *local_120;
        piVar54 = piVar46;
        if ((int)(uint)local_160 < 2) {
          uVar37 = 0;
          uVar56 = 0;
          iVar60 = 0;
        }
        else {
          local_160 = (ulong)((uint)local_160 & 0x7fffffff);
          iVar60 = 0;
          uVar36 = 1;
          uVar56 = 0;
          uVar37 = 0;
          do {
            if (iVar60 < 0xff && uVar31 == local_120[uVar36]) {
              iVar13 = iVar60 + 1;
            }
            else {
              lVar22 = *(long *)((long)__s + (ulong)uVar31 * 8);
              lVar27 = *local_d0;
              uVar48 = (uint)lVar22;
              uVar41 = uVar48 & 0x3f;
              uVar21 = (uint)lVar27;
              uVar42 = uVar21 & 0x3f;
              uVar63 = (ulong)iVar60;
              uVar57 = lVar22 >> 6;
              uVar61 = local_130;
              if ((long)((ulong)uVar41 + (ulong)uVar42 + 8) < (long)(uVar41 * uVar63)) {
                uVar57 = uVar37 << (sbyte)uVar41 | uVar57;
                uVar41 = (uVar48 & 0x3f) + (int)uVar56;
                uVar56 = (ulong)uVar41;
                if (7 < (int)uVar41) {
                  uVar56 = (ulong)uVar41;
                  do {
                    uVar56 = uVar56 - 8;
                    *(char *)piVar54 = (char)((long)uVar57 >> ((byte)uVar56 & 0x3f));
                    piVar54 = (int *)((long)piVar54 + 1);
                  } while (7 < uVar56);
                }
                uVar21 = uVar21 & 0x3f;
                uVar37 = uVar57 << (sbyte)uVar42 | lVar27 >> 6;
                uVar41 = (int)uVar56 + uVar21;
                if ((int)uVar41 < 8) {
                  uVar21 = uVar41 + 8;
                  uVar56 = (ulong)uVar21;
                  uVar37 = uVar37 << 8 | uVar63;
                  if (-1 < (int)uVar41) goto LAB_001d6910;
                }
                else {
                  uVar57 = (ulong)uVar41;
                  uVar21 = uVar21 + (int)uVar56 + 8;
                  do {
                    uVar57 = uVar57 - 8;
                    *(char *)piVar54 = (char)((long)uVar37 >> ((byte)uVar57 & 0x3f));
                    piVar54 = (int *)((long)piVar54 + 1);
                    uVar21 = uVar21 - 8;
                  } while (7 < uVar57);
                  uVar37 = uVar37 << 8 | uVar63;
LAB_001d6910:
                  uVar56 = (ulong)uVar21;
                  do {
                    uVar56 = uVar56 - 8;
                    *(char *)piVar54 = (char)((long)uVar37 >> ((byte)uVar56 & 0x3f));
                    piVar54 = (int *)((long)piVar54 + 1);
                  } while (7 < uVar56);
                }
                iVar13 = 0;
              }
              else {
                iVar13 = 0;
                if (-1 < iVar60) {
                  do {
                    uVar21 = (int)uVar56 + (uVar48 & 0x3f);
                    uVar56 = (ulong)uVar21;
                    uVar37 = uVar37 << (sbyte)uVar41 | uVar57;
                    if (7 < (int)uVar21) {
                      uVar56 = (ulong)uVar21;
                      do {
                        uVar56 = uVar56 - 8;
                        *(char *)piVar54 = (char)((long)uVar37 >> ((byte)uVar56 & 0x3f));
                        piVar54 = (int *)((long)piVar54 + 1);
                      } while (7 < uVar56);
                    }
                    bVar64 = 0 < iVar60;
                    iVar60 = iVar60 + -1;
                  } while (bVar64);
                }
              }
            }
            iVar60 = iVar13;
            uVar31 = local_120[uVar36];
            uVar36 = uVar36 + 1;
          } while (uVar36 != local_160);
        }
        lVar22 = *(long *)((long)__s + (ulong)uVar31 * 8);
        lVar27 = *local_d0;
        uVar48 = (uint)lVar22;
        uVar41 = uVar48 & 0x3f;
        uVar21 = (uint)lVar27;
        uVar42 = uVar21 & 0x3f;
        uVar36 = (ulong)iVar60;
        uVar57 = lVar22 >> 6;
        if ((long)((ulong)uVar41 + (ulong)uVar42 + 8) < (long)(uVar41 * uVar36)) {
          uVar57 = uVar37 << (sbyte)uVar41 | uVar57;
          uVar41 = (uVar48 & 0x3f) + (int)uVar56;
          uVar56 = (ulong)uVar41;
          if (7 < (int)uVar41) {
            uVar56 = (ulong)uVar41;
            do {
              uVar56 = uVar56 - 8;
              *(char *)piVar54 = (char)((long)uVar57 >> ((byte)uVar56 & 0x3f));
              piVar54 = (int *)((long)piVar54 + 1);
            } while (7 < uVar56);
          }
          uVar21 = uVar21 & 0x3f;
          uVar37 = uVar57 << (sbyte)uVar42 | lVar27 >> 6;
          uVar41 = (int)uVar56 + uVar21;
          if ((int)uVar41 < 8) {
            uVar21 = uVar41 + 8;
            uVar56 = (ulong)uVar21;
            uVar37 = uVar37 << 8 | uVar36;
            if ((int)uVar41 < 0) goto LAB_001d6a73;
          }
          else {
            uVar57 = (ulong)uVar41;
            uVar21 = uVar21 + (int)uVar56 + 8;
            do {
              uVar57 = uVar57 - 8;
              *(char *)piVar54 = (char)((long)uVar37 >> ((byte)uVar57 & 0x3f));
              piVar54 = (int *)((long)piVar54 + 1);
              uVar21 = uVar21 - 8;
            } while (7 < uVar57);
            uVar37 = uVar37 << 8 | uVar36;
          }
          uVar56 = (ulong)uVar21;
          do {
            uVar56 = uVar56 - 8;
            *(char *)piVar54 = (char)((long)uVar37 >> ((byte)uVar56 & 0x3f));
            piVar54 = (int *)((long)piVar54 + 1);
          } while (7 < uVar56);
        }
        else if (-1 < iVar60) {
          do {
            uVar21 = (int)uVar56 + (uVar48 & 0x3f);
            uVar56 = (ulong)uVar21;
            uVar37 = uVar37 << (sbyte)uVar41 | uVar57;
            if (7 < (int)uVar21) {
              uVar56 = (ulong)uVar21;
              do {
                uVar56 = uVar56 - 8;
                *(char *)piVar54 = (char)((long)uVar37 >> ((byte)uVar56 & 0x3f));
                piVar54 = (int *)((long)piVar54 + 1);
              } while (7 < uVar56);
            }
            bVar64 = 0 < iVar60;
            iVar60 = iVar60 + -1;
          } while (bVar64);
        }
LAB_001d6a73:
        iVar60 = (int)uVar56;
        if (iVar60 != 0) {
          *(char *)piVar54 = (char)(uVar37 << (8U - (char)uVar56 & 0x3f));
        }
        iVar51 = (int)piVar54 - (int)piVar46;
        lVar22 = (long)piVar46 - (long)local_150;
        iVar13 = iVar60 + iVar51 * 8 + 7;
        iVar25 = iVar60 + iVar51 * 8 + 0xe;
        if (-1 < iVar13) {
          iVar25 = iVar13;
        }
        *(char *)((long)&local_c0->start + 4) = (char)local_e0;
        *(char *)((long)&local_c0->start + 5) = (char)(local_e0 >> 8);
        *(char *)((long)&local_c0->start + 6) = (char)(local_e0 >> 0x10);
        *(char *)((long)&local_c0->start + 7) = (char)(local_e0 >> 0x18);
        *(char *)&local_c0->end = (char)lVar62;
        *(char *)((long)&local_c0->end + 1) = (char)((ulong)lVar62 >> 8);
        *(char *)((long)&local_c0->end + 2) = (char)((ulong)lVar62 >> 0x10);
        *(char *)((long)&local_c0->end + 3) = (char)((ulong)lVar62 >> 0x18);
        *(char *)((long)&local_c0->end + 4) = (char)lVar22;
        *(char *)((long)&local_c0->end + 5) = (char)((ulong)lVar22 >> 8);
        *(char *)((long)&local_c0->end + 6) = (char)((ulong)lVar22 >> 0x10);
        *(char *)((long)&local_c0->end + 7) = (char)((ulong)lVar22 >> 0x18);
        iVar60 = iVar60 + iVar51 * 8;
        *(char *)&local_c0->nx = (char)iVar60;
        *(char *)((long)&local_c0->nx + 1) = (char)((uint)iVar60 >> 8);
        *(char *)((long)&local_c0->nx + 2) = (char)((uint)iVar60 >> 0x10);
        *(char *)((long)&local_c0->nx + 3) = (char)((uint)iVar60 >> 0x18);
        iVar13 = (int)local_a0;
        iVar60 = ((iVar25 >> 3) + (int)piVar46) - iVar13;
        local_c0->ny = 0;
        operator_delete(__s);
      }
      *(int *)&pPVar17->start = iVar60;
      uVar56 = (ulong)(uint)((iVar13 - (int)local_68) + iVar60);
      if (uVar61 <= uVar56) {
        memcpy(local_68,local_70,uVar61);
        uVar56 = uVar61 & 0xffffffff;
      }
      operator_delete(pvVar18);
      pPVar17 = local_118;
      if (local_f8.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((ushort *)
          local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (ushort *)0x0) {
        operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(pPVar17);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_b0,*(undefined8 *)(local_b0 + 8),
                 CONCAT44(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start),
                 uVar56 + CONCAT44(local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
      local_f8.super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
LAB_001d6bb7:
      if (local_f8.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_001d6bc1;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
LAB_001d6d0f:
  uVar20 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0)
  ;
  operator_delete(pPVar17);
  operator_delete(images);
  operator_delete(local_170);
  operator_delete(local_98);
  if (local_f8.super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((ushort *)
      local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (ushort *)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_118);
  if ((void *)CONCAT44(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
  }
  if ((void *)CONCAT44(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)local_110.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_110.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_110.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
  }
  _Unwind_Resume(uVar20);
LAB_001d6bf4:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001d6c02:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001d6c10:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001d6c1e:
  pPVar17 = (pointer)CONCAT44(uVar11,iVar60);
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_001d6c2c;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,                         
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if TINYEXR_USE_MINIZ
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()));

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}